

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_cipher_set_iv(psa_cipher_operation_t *operation,uint8_t *iv,size_t iv_length)

{
  int ret;
  psa_status_t pVar1;
  
  pVar1 = -0x89;
  if ((operation->field_0x4 & 6) == 2) {
    pVar1 = -0x87;
    if (operation->iv_size == iv_length) {
      ret = mbedtls_cipher_set_iv(&(operation->ctx).cipher,iv,iv_length);
      pVar1 = mbedtls_to_psa_error(ret);
    }
    if (pVar1 == 0) {
      operation->field_0x4 = operation->field_0x4 | 4;
    }
    else {
      psa_cipher_abort(operation);
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_cipher_set_iv( psa_cipher_operation_t *operation,
                                const uint8_t *iv,
                                size_t iv_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if( operation->iv_set || ! operation->iv_required )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( iv_length != operation->iv_size )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }
    ret = mbedtls_cipher_set_iv( &operation->ctx.cipher, iv, iv_length );
    status = mbedtls_to_psa_error( ret );
exit:
    if( status == PSA_SUCCESS )
        operation->iv_set = 1;
    else
        psa_cipher_abort( operation );
    return( status );
}